

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

int run_test_fork_signal_to_child(void)

{
  int iVar1;
  uint __pid;
  __pid_t __pid_00;
  undefined8 uVar2;
  ssize_t sVar3;
  ulong unaff_RBX;
  char sync_buf [1];
  int sync_pipe [2];
  uv_signal_t signal_handle;
  undefined1 uStack_169;
  int iStack_168;
  int iStack_164;
  int iStack_160;
  int iStack_15c;
  undefined1 auStack_158 [152];
  code *pcStack_c0;
  undefined1 local_a9;
  int local_a8;
  int local_a4;
  undefined1 local_a0 [152];
  
  fork_signal_cb_called = 0;
  pcStack_c0 = (code *)0x14f2b5;
  iVar1 = pipe(&local_a8);
  if (iVar1 == 0) {
    pcStack_c0 = (code *)0x14f2c2;
    run_timer_loop_once();
    pcStack_c0 = (code *)0x14f2c7;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x14f2d4;
    iVar1 = uv_signal_init(uVar2,local_a0);
    if (iVar1 != 0) goto LAB_0014f455;
    pcStack_c0 = (code *)0x14f2f2;
    iVar1 = uv_signal_start(local_a0,fork_signal_to_child_cb,10);
    if (iVar1 != 0) goto LAB_0014f45a;
    pcStack_c0 = (code *)0x14f2ff;
    __pid = fork();
    if (__pid != 0) {
      unaff_RBX = (ulong)__pid;
      if (__pid == 0xffffffff) goto LAB_0014f464;
      pcStack_c0 = (code *)0x14f325;
      sVar3 = read(local_a8,&local_a9,1);
      if (sVar3 != 1) goto LAB_0014f469;
      pcStack_c0 = (code *)0x14f33b;
      iVar1 = kill(__pid,10);
      if (iVar1 != 0) goto LAB_0014f473;
      pcStack_c0 = (code *)0x14f34f;
      puts("Running loop in parent");
      pcStack_c0 = (code *)0x14f359;
      uv_unref(local_a0);
      pcStack_c0 = (code *)0x14f35e;
      uVar2 = uv_default_loop();
      pcStack_c0 = (code *)0x14f36b;
      iVar1 = uv_run(uVar2,2);
      if (iVar1 != 0) goto LAB_0014f47d;
      if (fork_signal_cb_called == 0) {
        pcStack_c0 = (code *)0x14f38c;
        puts("Waiting for child in parent");
        pcStack_c0 = (code *)0x14f393;
        assert_wait_child(__pid);
LAB_0014f411:
        pcStack_c0 = (code *)0x14f416;
        unaff_RBX = uv_default_loop();
        pcStack_c0 = (code *)0x14f42a;
        uv_walk(unaff_RBX,close_walk_cb,0);
        pcStack_c0 = (code *)0x14f434;
        uv_run(unaff_RBX,0);
        pcStack_c0 = (code *)0x14f439;
        uVar2 = uv_default_loop();
        pcStack_c0 = (code *)0x14f441;
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          return 0;
        }
        goto LAB_0014f45f;
      }
      goto LAB_0014f487;
    }
    pcStack_c0 = (code *)0x14f39a;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x14f3a2;
    iVar1 = uv_loop_fork(uVar2);
    if (iVar1 != 0) goto LAB_0014f46e;
    pcStack_c0 = (code *)0x14f3bf;
    sVar3 = write(local_a4,"1",1);
    if (sVar3 != 1) goto LAB_0014f478;
    pcStack_c0 = (code *)0x14f3ce;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x14f3d6;
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 == 0) goto LAB_0014f482;
    pcStack_c0 = (code *)0x14f3ea;
    puts("Running loop in child");
    pcStack_c0 = (code *)0x14f3ef;
    uVar2 = uv_default_loop();
    pcStack_c0 = (code *)0x14f3fc;
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_0014f48c;
    if (fork_signal_cb_called == 10) goto LAB_0014f411;
  }
  else {
    pcStack_c0 = (code *)0x14f455;
    run_test_fork_signal_to_child_cold_1();
LAB_0014f455:
    pcStack_c0 = (code *)0x14f45a;
    run_test_fork_signal_to_child_cold_2();
LAB_0014f45a:
    pcStack_c0 = (code *)0x14f45f;
    run_test_fork_signal_to_child_cold_3();
LAB_0014f45f:
    pcStack_c0 = (code *)0x14f464;
    run_test_fork_signal_to_child_cold_14();
LAB_0014f464:
    pcStack_c0 = (code *)0x14f469;
    run_test_fork_signal_to_child_cold_9();
LAB_0014f469:
    pcStack_c0 = (code *)0x14f46e;
    run_test_fork_signal_to_child_cold_10();
LAB_0014f46e:
    pcStack_c0 = (code *)0x14f473;
    run_test_fork_signal_to_child_cold_4();
LAB_0014f473:
    pcStack_c0 = (code *)0x14f478;
    run_test_fork_signal_to_child_cold_11();
LAB_0014f478:
    pcStack_c0 = (code *)0x14f47d;
    run_test_fork_signal_to_child_cold_5();
LAB_0014f47d:
    pcStack_c0 = (code *)0x14f482;
    run_test_fork_signal_to_child_cold_12();
LAB_0014f482:
    pcStack_c0 = (code *)0x14f487;
    run_test_fork_signal_to_child_cold_8();
LAB_0014f487:
    pcStack_c0 = (code *)0x14f48c;
    run_test_fork_signal_to_child_cold_13();
LAB_0014f48c:
    pcStack_c0 = (code *)0x14f491;
    run_test_fork_signal_to_child_cold_6();
  }
  pcStack_c0 = run_test_fork_signal_to_child_closed;
  run_test_fork_signal_to_child_cold_7();
  fork_signal_cb_called = 0;
  pcStack_c0 = (code *)unaff_RBX;
  iVar1 = pipe(&iStack_160);
  if (iVar1 == 0) {
    iVar1 = pipe(&iStack_168);
    if (iVar1 != 0) goto LAB_0014f636;
    run_timer_loop_once();
    uVar2 = uv_default_loop();
    iVar1 = uv_signal_init(uVar2,auStack_158);
    if (iVar1 != 0) goto LAB_0014f63b;
    iVar1 = uv_signal_start(auStack_158,fork_signal_to_child_cb,10);
    if (iVar1 != 0) goto LAB_0014f640;
    __pid_00 = fork();
    if (__pid_00 == 0) goto LAB_0014f645;
    if (__pid_00 == -1) goto LAB_0014f678;
    puts("Wating on child in parent");
    sVar3 = read(iStack_160,&uStack_169,1);
    if (sVar3 != 1) goto LAB_0014f67d;
    puts("Parent killing child");
    iVar1 = kill(__pid_00,10);
    if (iVar1 != 0) goto LAB_0014f682;
    puts("Running loop in parent");
    uv_unref(auStack_158);
    run_timer_loop_once();
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_0014f687;
    printf("Signal in parent %d\n",(ulong)(uint)fork_signal_cb_called);
    if (fork_signal_cb_called != 0) goto LAB_0014f68c;
    sVar3 = write(iStack_164,"1",1);
    if (sVar3 != 1) goto LAB_0014f691;
    puts("Waiting for child in parent");
    assert_wait_child(__pid_00);
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
LAB_0014f696:
    run_test_fork_signal_to_child_closed_cold_16();
LAB_0014f69b:
    run_test_fork_signal_to_child_closed_cold_5();
  }
  else {
    run_test_fork_signal_to_child_closed_cold_1();
LAB_0014f636:
    run_test_fork_signal_to_child_closed_cold_2();
LAB_0014f63b:
    run_test_fork_signal_to_child_closed_cold_3();
LAB_0014f640:
    run_test_fork_signal_to_child_closed_cold_4();
LAB_0014f645:
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar2);
    if (iVar1 != 0) goto LAB_0014f69b;
    puts("Checking loop in child");
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 == 0) {
      run_test_fork_signal_to_child_closed_cold_9();
LAB_0014f678:
      run_test_fork_signal_to_child_closed_cold_10();
LAB_0014f67d:
      run_test_fork_signal_to_child_closed_cold_11();
LAB_0014f682:
      run_test_fork_signal_to_child_closed_cold_12();
LAB_0014f687:
      run_test_fork_signal_to_child_closed_cold_13();
LAB_0014f68c:
      run_test_fork_signal_to_child_closed_cold_14();
LAB_0014f691:
      run_test_fork_signal_to_child_closed_cold_15();
      goto LAB_0014f696;
    }
  }
  puts("Alerting parent in child");
  sVar3 = write(iStack_15c,"1",1);
  if (sVar3 == 1) {
    puts("Waiting on parent in child");
    sVar3 = read(iStack_168,&uStack_169,1);
    if ((int)sVar3 + 1U < 3) {
      if (fork_signal_cb_called == 0) {
        puts("Exiting child ");
        exit(0);
      }
      goto LAB_0014f713;
    }
  }
  else {
    run_test_fork_signal_to_child_closed_cold_6();
  }
  run_test_fork_signal_to_child_closed_cold_7();
LAB_0014f713:
  run_test_fork_signal_to_child_closed_cold_8();
  _do_fork_fs_events_child(0);
  return 0;
}

Assistant:

TEST_IMPL(fork_signal_to_child) {
  /* A signal handler installed before forking
     is run only in the child when the child is signalled. */
  uv_signal_t signal_handle;
  pid_t child_pid;
  int sync_pipe[2];
  char sync_buf[1];

  fork_signal_cb_called = 0;    /* reset */

  ASSERT(0 == pipe(sync_pipe));

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == uv_signal_init(uv_default_loop(), &signal_handle));
  ASSERT(0 == uv_signal_start(&signal_handle, fork_signal_to_child_cb, SIGUSR1));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(1 == read(sync_pipe[0], sync_buf, 1)); /* wait for child */
    ASSERT(0 == kill(child_pid, SIGUSR1));
    /* Run the loop, make sure we don't get the signal. */
    printf("Running loop in parent\n");
    uv_unref((uv_handle_t*)&signal_handle);
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));
    ASSERT(0 == fork_signal_cb_called);
    printf("Waiting for child in parent\n");
    assert_wait_child(child_pid);
  } else {
    /* child */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(1 == write(sync_pipe[1], "1", 1)); /* alert parent */
    /* Get the signal. */
    ASSERT(0 != uv_loop_alive(uv_default_loop()));
    printf("Running loop in child\n");
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
    ASSERT(SIGUSR1 == fork_signal_cb_called);
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}